

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutorTests.cpp
# Opt level: O0

void testProgram(string *code,string *out,int status)

{
  undefined1 uVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  pointer pNVar5;
  string *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Executor executor;
  unique_ptr<Node,_std::default_delete<Node>_> program;
  Parser parser;
  stringstream stream;
  Executor *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffb44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb48;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  int line;
  Executor *this;
  Type in_stack_fffffffffffffb6c;
  AssertHelper *in_stack_fffffffffffffb70;
  AssertionResult local_480 [2];
  string local_460 [24];
  Message *in_stack_fffffffffffffbb8;
  AssertHelper *in_stack_fffffffffffffbc0;
  undefined1 local_430 [104];
  Parser *in_stack_fffffffffffffc38;
  
  _Var3 = std::operator|(_S_out,_S_in);
  this = (Executor *)&stack0xfffffffffffffe60;
  std::__cxx11::stringstream::stringstream((stringstream *)this,in_RDI,_Var3);
  Parser::Parser((Parser *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (istream *)in_stack_fffffffffffffb38);
  Parser::parseProgram(in_stack_fffffffffffffc38);
  Executor::Executor(this);
  pNVar5 = std::unique_ptr<Node,_std::default_delete<Node>_>::operator->
                     ((unique_ptr<Node,_std::default_delete<Node>_> *)0x1ebe42);
  (*pNVar5->_vptr_Node[2])(pNVar5,local_430);
  Executor::getStandardOut_abi_cxx11_(in_stack_fffffffffffffb38);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((char *)in_RDI,(char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
             in_stack_fffffffffffffb48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  std::__cxx11::string::~string(local_460);
  uVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffbc0);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    in_stack_fffffffffffffb48 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x1ebf7e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,(char *)this,
               (int)((ulong)in_RDI >> 0x20),(char *)CONCAT17(uVar1,in_stack_fffffffffffffb50));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    testing::Message::~Message((Message *)0x1ebfcc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ec01b);
  iVar4 = Executor::getExitCode((Executor *)local_430);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_RDI,(char *)CONCAT17(uVar1,in_stack_fffffffffffffb50),
             (int *)in_stack_fffffffffffffb48,(int *)CONCAT44(iVar4,in_stack_fffffffffffffb40));
  line = (int)((ulong)in_RDI >> 0x20);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_480);
  uVar6 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffb40);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb70);
    testing::AssertionResult::failure_message((AssertionResult *)0x1ec0bd);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,(char *)this,line,
               (char *)CONCAT17(uVar1,in_stack_fffffffffffffb50));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(iVar4,uVar6));
    testing::Message::~Message((Message *)0x1ec109);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ec155);
  Executor::~Executor((Executor *)CONCAT44(iVar4,uVar6));
  std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr
            ((unique_ptr<Node,_std::default_delete<Node>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffb50));
  Parser::~Parser((Parser *)0x1ec17c);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe60);
  return;
}

Assistant:

void testProgram(const std::string code, const std::string& out, int status)
{
  std::stringstream stream{code};
  Parser parser{stream};
  auto program = parser.parseProgram();

  Executor executor{};
  program->accept(executor);

  EXPECT_EQ(executor.getStandardOut(), out);
  EXPECT_EQ(executor.getExitCode(), status);
}